

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

void google::protobuf::internal::WireFormatLite::WriteBool
               (int field_number,bool value,CodedOutputStream *output)

{
  CodedOutputStream *in_RDX;
  uint32 in_EDI;
  CodedOutputStream *this;
  CodedOutputStream *this_00;
  
  this = in_RDX;
  this_00 = in_RDX;
  MakeTag(in_EDI,WIRETYPE_VARINT);
  io::CodedOutputStream::WriteTag(this,(uint32)((ulong)in_RDX >> 0x20));
  io::CodedOutputStream::WriteVarint32(this_00,in_EDI);
  return;
}

Assistant:

void WireFormatLite::WriteBool(int field_number, bool value,
                               io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_VARINT, output);
  WriteBoolNoTag(value, output);
}